

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::ParseAddtlInfo_SnapMapInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  uint32 uVar1;
  SnapMapInfo *addtlInfo;
  void **ppvVar2;
  FileReader *reader_00;
  TTDVar pvVar3;
  FileReader *reader_01;
  uint local_2c;
  uint32 i;
  SnapMapInfo *mapInfo;
  SlabAllocator *alloc_local;
  FileReader *reader_local;
  SnapObject *snpObject_local;
  
  addtlInfo = SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::SnapMapInfo>(alloc);
  uVar1 = FileReader::ReadLengthValue(reader,true);
  addtlInfo->MapSize = uVar1;
  if (addtlInfo->MapSize == 0) {
    addtlInfo->MapKeyValueArray = (TTDVar *)0x0;
  }
  else {
    ppvVar2 = SlabAllocatorBase<0>::SlabAllocateArray<void*>(alloc,(ulong)addtlInfo->MapSize);
    addtlInfo->MapKeyValueArray = ppvVar2;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    for (local_2c = 0; local_2c < addtlInfo->MapSize; local_2c = local_2c + 2) {
      (*reader->_vptr_FileReader[4])(reader,(ulong)(local_2c != 0));
      reader_00 = (FileReader *)
                  NSSnapValues::ParseTTDVar((NSSnapValues *)0x0,SUB81(reader,0),reader_01);
      addtlInfo->MapKeyValueArray[local_2c] = reader_00;
      pvVar3 = NSSnapValues::ParseTTDVar((NSSnapValues *)&DAT_00000001,SUB81(reader,0),reader_00);
      addtlInfo->MapKeyValueArray[local_2c + 1] = pvVar3;
      (*reader->_vptr_FileReader[5])();
    }
    (*reader->_vptr_FileReader[5])();
  }
  SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapMapInfo*,(TTD::NSSnapObjects::SnapObjectType)26>
            (snpObject,addtlInfo);
  return;
}

Assistant:

void ParseAddtlInfo_SnapMapInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapMapInfo* mapInfo = alloc.SlabAllocateStruct<SnapMapInfo>();

            mapInfo->MapSize = reader->ReadLengthValue(true);
            if(mapInfo->MapSize == 0)
            {
                mapInfo->MapKeyValueArray = nullptr;
            }
            else
            {
                mapInfo->MapKeyValueArray = alloc.SlabAllocateArray<TTDVar>(mapInfo->MapSize);

                reader->ReadSequenceStart_WDefaultKey(true);
                for(uint32 i = 0; i < mapInfo->MapSize; i += 2)
                {
                    reader->ReadSequenceStart(i != 0);
                    mapInfo->MapKeyValueArray[i] = NSSnapValues::ParseTTDVar(false, reader);
                    mapInfo->MapKeyValueArray[i + 1] = NSSnapValues::ParseTTDVar(true, reader);
                    reader->ReadSequenceEnd();
                }
                reader->ReadSequenceEnd();
            }

            SnapObjectSetAddtlInfoAs<SnapMapInfo*, SnapObjectType::SnapMapObject>(snpObject, mapInfo);
        }